

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::expect(parser *this,token_type t)

{
  token_type t_00;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string error_msg;
  string local_78;
  string_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->last_token == t) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&error_msg,"parse error - unexpected ",(allocator *)&bStack_b8);
  t_00 = this->last_token;
  if (t_00 == parse_error) {
    lexer::get_token_string(&local_58,&this->m_lexer);
    std::operator+(&local_38,"\'",&local_58);
    std::operator+(&bStack_b8,&local_38,"\'");
  }
  else {
    lexer::token_type_name(&bStack_b8,t_00);
  }
  std::__cxx11::string::append((string *)&error_msg);
  std::__cxx11::string::~string((string *)&bStack_b8);
  if (t_00 == parse_error) {
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  lexer::token_type_name(&local_78,t);
  std::operator+(&bStack_b8,"; expected ",&local_78);
  std::__cxx11::string::append((string *)&error_msg);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,(string *)&error_msg);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void expect(typename lexer::token_type t) const
        {
            if (t != last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                error_msg += "; expected " + lexer::token_type_name(t);
                JSON_THROW(std::invalid_argument(error_msg));
            }
        }